

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_reduceTable(U32 *table,U32 size,U32 reducerValue)

{
  U32 reducerValue_local;
  U32 size_local;
  U32 *table_local;
  U32 adder;
  int column;
  int rowNb;
  int cellNb;
  int nbRows;
  
  column = 0;
  if ((size & 0xf) != 0) {
    __assert_fail("(size & (ZSTD_ROWSIZE-1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3177,
                  "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)");
  }
  if (size < 0x80000000) {
    for (adder = 0; (int)adder < (int)size / 0x10; adder = adder + 1) {
      for (table_local._4_4_ = 0; table_local._4_4_ < 0x10;
          table_local._4_4_ = table_local._4_4_ + 1) {
        if (table[column] < reducerValue) {
          table[column] = 0;
        }
        else {
          table[column] = table[column] - reducerValue;
        }
        column = column + 1;
      }
    }
    return;
  }
  __assert_fail("size < (1U<<31)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x3178,
                "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)");
}

Assistant:

static void ZSTD_reduceTable(U32* const table, U32 const size, U32 const reducerValue)
{
    ZSTD_reduceTable_internal(table, size, reducerValue, 0);
}